

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

string_view __thiscall choc::value::ValueView::getString(ValueView *this)

{
  StringDictionary *pSVar1;
  undefined8 in_RAX;
  undefined8 in_RDX;
  string_view sVar2;
  undefined4 extraout_var;
  char *extraout_RDX;
  
  pSVar1 = this->stringDictionary;
  if (pSVar1 == (StringDictionary *)0x0) {
    throwError("No string dictionary supplied");
  }
  if ((this->type).mainType == string) {
    sVar2._M_len._0_4_ =
         (*pSVar1->_vptr_StringDictionary[3])(pSVar1,(ulong)*(uint *)this->data,in_RDX,in_RAX);
    sVar2._M_len._4_4_ = extraout_var;
    sVar2._M_str = extraout_RDX;
    return sVar2;
  }
  throwError("Value is not a string");
}

Assistant:

inline std::string_view ValueView::getString() const
{
    check (stringDictionary != nullptr, "No string dictionary supplied");
    return stringDictionary->getStringForHandle (getStringHandle());
}